

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.c
# Opt level: O2

int pub0_sock_set_sendbuf(void *arg,void *buf,size_t sz,nni_type t)

{
  int iVar1;
  void *item;
  int local_2c [2];
  int val;
  
  iVar1 = nni_copyin_int(local_2c,buf,sz,1,0x2000,t);
  if (iVar1 == 0) {
    nni_mtx_lock((nni_mtx *)((long)arg + 0x18));
    *(long *)((long)arg + 0x48) = (long)local_2c[0];
    for (item = nni_list_first((nni_list *)arg); item != (void *)0x0;
        item = nni_list_next((nni_list *)arg,item)) {
      iVar1 = nni_lmq_resize((nni_lmq *)((long)item + 0x10),(long)local_2c[0]);
      if (iVar1 != 0) goto LAB_00128654;
    }
    iVar1 = 0;
LAB_00128654:
    nni_mtx_unlock((nni_mtx *)((long)arg + 0x18));
  }
  return iVar1;
}

Assistant:

static int
pub0_sock_set_sendbuf(void *arg, const void *buf, size_t sz, nni_type t)
{
	pub0_sock *sock = arg;
	pub0_pipe *p;
	int        val;
	int        rv;

	if ((rv = nni_copyin_int(&val, buf, sz, 1, 8192, t)) != 0) {
		return (rv);
	}

	nni_mtx_lock(&sock->mtx);
	sock->sendbuf = (size_t) val;
	NNI_LIST_FOREACH (&sock->pipes, p) {
		// If we fail part way through (should only be ENOMEM), we
		// stop short.  The others would likely fail for ENOMEM as
		// well anyway.  There is a weird effect here where the
		// buffers may have been set for *some* of the pipes, but
		// we have no way to correct partial failure.
		if ((rv = nni_lmq_resize(&p->sendq, (size_t) val)) != 0) {
			break;
		}
	}
	nni_mtx_unlock(&sock->mtx);
	return (rv);
}